

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void Hash_init(HashInfo *info)

{
  long *in_RDI;
  
  if ((code *)*in_RDI == sha2_224_64) {
    sha224_init((hash_state *)0x106601);
  }
  else if ((code *)*in_RDI == rmd128) {
    rmd128_init((hash_state *)0x10661f);
  }
  else if ((code *)*in_RDI == clhash_test) {
    clhash_init();
  }
  else if ((code *)*in_RDI == tsip_test) {
    tsip_init();
  }
  return;
}

Assistant:

void Hash_init (HashInfo* info) {
  if (info->hash == sha2_224_64)
    sha224_init(&ltc_state);
  else if (info->hash == rmd128)
    rmd128_init(&ltc_state);
#if defined(__SSE4_2__) && defined(__x86_64__)
  else if(info->hash == clhash_test)
    clhash_init();
#endif
#ifdef HAVE_HIGHWAYHASH
  else if(info->hash == HighwayHash64_test)
    HighwayHash_init();
#endif
#ifndef _MSC_VER
  else if(info->hash == tsip_test)
    tsip_init();
#endif
}